

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall TaskProvider::TaskProvider(TaskProvider *this,ThreadPool *pool)

{
  AbstractTaskProvider *in_RSI;
  undefined8 *in_RDI;
  
  AbstractTaskProvider::AbstractTaskProvider(in_RSI);
  *in_RDI = &PTR__TaskProvider_00217ca0;
  in_RDI[0x11] = in_RSI;
  return;
}

Assistant:

TaskProvider::TaskProvider( ThreadPool * pool )
    : _threadPool ( pool )
{
}